

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2sSpecialFloatTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles2::Stress::anon_unknown_0::UniformCase::iterate(UniformCase *this)

{
  ostringstream *this_00;
  uint uVar1;
  RenderContext *context;
  short sVar2;
  bool bVar3;
  int iVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  deUint32 err;
  long lVar7;
  pointer puVar8;
  undefined4 extraout_var;
  short sVar9;
  int x;
  long lVar10;
  long lVar11;
  char *description;
  long lVar12;
  qpTestResult testResult;
  int y;
  long lVar13;
  pointer puVar14;
  unsigned_short uVar15;
  unsigned_short uVar16;
  float posX;
  float fVar17;
  float fVar18;
  Surface resultImage;
  vector<unsigned_short,_std::allocator<unsigned_short>_> indices;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> gridVertices;
  UVec4 uniformValue;
  
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&gridVertices,0x211,(allocator_type *)&uniformValue);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            (&indices,0xb58,(allocator_type *)&uniformValue);
  tcu::Surface::Surface(&resultImage,0x100,0x100);
  lVar7 = 8;
  for (lVar10 = 0; lVar10 != 0x17; lVar10 = lVar10 + 1) {
    fVar17 = (float)(int)lVar10 / 22.0;
    lVar11 = lVar7;
    for (lVar13 = 0; lVar13 != 0x17; lVar13 = lVar13 + 1) {
      fVar18 = (float)(int)lVar13 / 22.0;
      *(float *)((long)(gridVertices.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar11 + -8) =
           fVar17 + fVar17 + -1.0;
      *(float *)((long)(gridVertices.
                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar11 + -4) =
           fVar18 + fVar18 + -1.0;
      *(undefined8 *)
       ((long)(gridVertices.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start)->m_data + lVar11) = 0x3f80000000000000;
      lVar11 = lVar11 + 0x10;
    }
    lVar7 = lVar7 + 0x170;
  }
  puVar8 = indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_start + 5;
  sVar9 = 0;
  for (lVar7 = 0; puVar14 = puVar8, lVar10 = -0x16, lVar7 != 0x16; lVar7 = lVar7 + 1) {
    for (; lVar10 != 0; lVar10 = lVar10 + 1) {
      sVar2 = (short)lVar10;
      uVar15 = sVar9 + sVar2 + 0x16;
      puVar14[-5] = uVar15;
      uVar16 = sVar9 + 0x2e + sVar2;
      puVar14[-4] = uVar16;
      puVar14[-3] = sVar9 + 0x2d + sVar2;
      puVar14[-2] = uVar15;
      puVar14[-1] = uVar16;
      *puVar14 = sVar9 + sVar2 + 0x17;
      puVar14 = puVar14 + 6;
    }
    puVar8 = puVar8 + 0x84;
    sVar9 = sVar9 + 0x17;
  }
  uniformValue.m_data._0_8_ =
       ((this->super_RenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_00 = (ostringstream *)(uniformValue.m_data + 2);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::operator<<((ostream *)this_00,
                  "Drawing a grid with the shader. Setting u_special for vertex each tile to (special, special, 1, 1)."
                 );
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&uniformValue,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  iVar4 = (*((this->super_RenderCase).super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext[3]
          )();
  lVar7 = CONCAT44(extraout_var,iVar4);
  uVar5 = (**(code **)(lVar7 + 0x780))
                    ((((this->super_RenderCase).m_program)->m_program).m_program,"a_pos");
  uVar6 = (**(code **)(lVar7 + 0xb48))
                    ((((this->super_RenderCase).m_program)->m_program).m_program,"u_special");
  (**(code **)(lVar7 + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(lVar7 + 0x188))(0x4000);
  (**(code **)(lVar7 + 0x1a00))(0,0,0x100);
  (**(code **)(lVar7 + 0x1680))((((this->super_RenderCase).m_program)->m_program).m_program);
  (**(code **)(lVar7 + 0x19f0))
            (uVar5,4,0x1406,0,0,
             gridVertices.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start);
  (**(code **)(lVar7 + 0x610))(uVar5);
  lVar11 = 0;
  for (lVar10 = 0; lVar10 != 0x16; lVar10 = lVar10 + 1) {
    uVar1 = (&(anonymous_namespace)::s_specialFloats)[lVar10];
    lVar13 = lVar11;
    for (lVar12 = 0; lVar12 != 0x58; lVar12 = lVar12 + 4) {
      uniformValue.m_data[1] = *(uint *)((long)&(anonymous_namespace)::s_specialFloats + lVar12);
      uniformValue.m_data[0] = uVar1;
      uniformValue.m_data[2] = 0x3f800000;
      uniformValue.m_data[3] = 0x3f800000;
      (**(code **)(lVar7 + 0x15a8))(uVar6,1,&uniformValue);
      (**(code **)(lVar7 + 0x568))
                (4,6,0x1403,
                 (long)indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar13);
      lVar13 = lVar13 + 0xc;
    }
    lVar11 = lVar11 + 0x108;
  }
  (**(code **)(lVar7 + 0x518))(uVar5);
  (**(code **)(lVar7 + 0x1680))(0);
  (**(code **)(lVar7 + 0x648))();
  err = (**(code **)(lVar7 + 0x800))();
  glu::checkError(err,"UniformCase::iterate",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/stress/es2sSpecialFloatTests.cpp"
                  ,0x376);
  context = ((this->super_RenderCase).super_TestCase.m_context)->m_renderCtx;
  tcu::Surface::getAccess((PixelBufferAccess *)&uniformValue,&resultImage);
  testResult = QP_TEST_RESULT_FAIL;
  glu::readPixels(context,0,0,(PixelBufferAccess *)&uniformValue);
  bVar3 = RenderCase::checkResultImage(&this->super_RenderCase,&resultImage);
  if (bVar3) {
    bVar3 = RenderCase::drawTestPattern(&this->super_RenderCase,false);
    testResult = (qpTestResult)!bVar3;
    description = "test pattern failed";
    if (bVar3) {
      description = "Pass";
    }
  }
  else {
    description = "missing or invalid fragments";
  }
  tcu::TestContext::setTestResult
            ((this->super_RenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
             testResult,description);
  tcu::Surface::~Surface(&resultImage);
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
            (&indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
  std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
            (&gridVertices.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
  return STOP;
}

Assistant:

UniformCase::IterateResult UniformCase::iterate (void)
{
	// Create a [s_specialFloats] X [s_specialFloats] grid of tile with each tile having 2 [s_specialFloats] values
	// and calculate some basic operations with the floating point values. If all goes well, nothing special should happen

	std::vector<tcu::Vec4>	gridVertices	((DE_LENGTH_OF_ARRAY(s_specialFloats) + 1) * (DE_LENGTH_OF_ARRAY(s_specialFloats) + 1));
	std::vector<deUint16>	indices			(DE_LENGTH_OF_ARRAY(s_specialFloats) * DE_LENGTH_OF_ARRAY(s_specialFloats) * 6);
	tcu::Surface			resultImage		(TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);

	// vertices
	for (int x = 0; x < DE_LENGTH_OF_ARRAY(s_specialFloats) + 1; ++x)
	for (int y = 0; y < DE_LENGTH_OF_ARRAY(s_specialFloats) + 1; ++y)
	{
		const float		posX	= (float)x / (float)DE_LENGTH_OF_ARRAY(s_specialFloats) * 2.0f - 1.0f; // map from [0, len(s_specialFloats) ] to [-1, 1]
		const float		posY	= (float)y / (float)DE_LENGTH_OF_ARRAY(s_specialFloats) * 2.0f - 1.0f;

		gridVertices[x * (DE_LENGTH_OF_ARRAY(s_specialFloats)+1) + y] = tcu::Vec4(posX, posY, 0.0f, 1.0f);
	}

	// tiles
	for (int x = 0; x < DE_LENGTH_OF_ARRAY(s_specialFloats); ++x)
	for (int y = 0; y < DE_LENGTH_OF_ARRAY(s_specialFloats); ++y)
	{
		const int baseNdx = (x * (DE_LENGTH_OF_ARRAY(s_specialFloats)) + y) * 6;

		indices[baseNdx + 0] = (deUint16)((x+0) * (DE_LENGTH_OF_ARRAY(s_specialFloats) + 1) + (y+0));
		indices[baseNdx + 1] = (deUint16)((x+1) * (DE_LENGTH_OF_ARRAY(s_specialFloats) + 1) + (y+1));
		indices[baseNdx + 2] = (deUint16)((x+1) * (DE_LENGTH_OF_ARRAY(s_specialFloats) + 1) + (y+0));

		indices[baseNdx + 3] = (deUint16)((x+0) * (DE_LENGTH_OF_ARRAY(s_specialFloats) + 1) + (y+0));
		indices[baseNdx + 4] = (deUint16)((x+1) * (DE_LENGTH_OF_ARRAY(s_specialFloats) + 1) + (y+1));
		indices[baseNdx + 5] = (deUint16)((x+0) * (DE_LENGTH_OF_ARRAY(s_specialFloats) + 1) + (y+1));
	}

	m_testCtx.getLog() << tcu::TestLog::Message << "Drawing a grid with the shader. Setting u_special for vertex each tile to (special, special, 1, 1)." << tcu::TestLog::EndMessage;

	// Draw grid
	{
		const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
		const GLint				positionLoc	= gl.getAttribLocation(m_program->getProgram(), "a_pos");
		const GLint				specialLoc	= gl.getUniformLocation(m_program->getProgram(), "u_special");

		gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
		gl.clear(GL_COLOR_BUFFER_BIT);
		gl.viewport(0, 0, TEST_CANVAS_SIZE, TEST_CANVAS_SIZE);
		gl.useProgram(m_program->getProgram());

		gl.vertexAttribPointer(positionLoc, 4, GL_FLOAT, GL_FALSE, 0, &gridVertices[0]);
		gl.enableVertexAttribArray(positionLoc);

		for (int x = 0; x < DE_LENGTH_OF_ARRAY(s_specialFloats); ++x)
		for (int y = 0; y < DE_LENGTH_OF_ARRAY(s_specialFloats); ++y)
		{
			const deUint32		one				= 0x3F800000;
			const tcu::UVec4	uniformValue	= tcu::UVec4(s_specialFloats[x], s_specialFloats[y], one, one);
			const int			indexIndex		= (x * DE_LENGTH_OF_ARRAY(s_specialFloats) + y) * 6;

			gl.uniform4fv(specialLoc, 1, (const float*)uniformValue.getPtr());
			gl.drawElements(GL_TRIANGLES, 6, GL_UNSIGNED_SHORT, &indices[indexIndex]);
		}

		gl.disableVertexAttribArray(positionLoc);

		gl.useProgram(0);
		gl.finish();
		GLU_EXPECT_NO_ERROR(gl.getError(), "UniformCase::iterate");

		glu::readPixels(m_context.getRenderContext(), 0, 0, resultImage.getAccess());
	}

	// verify everywhere was drawn (all pixels have Green = 255)
	if (!checkResultImage(resultImage))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "missing or invalid fragments");
		return STOP;
	}

	// test drawing still works
	if (!drawTestPattern(false))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "test pattern failed");
		return STOP;
	}

	// all ok
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}